

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall TArray<FName,_FName>::Insert(TArray<FName,_FName> *this,uint index,FName *item)

{
  if (index < this->Count) {
    Resize(this,this->Count + 1);
    memmove(this->Array + (ulong)index + 1,this->Array + index,(ulong)(~index + this->Count) << 2);
  }
  else {
    Resize(this,index + 1);
  }
  this->Array[index].Index = item->Index;
  return;
}

Assistant:

void Insert (unsigned int index, const T &item)
	{
		if (index >= Count)
		{
			// Inserting somewhere past the end of the array, so we can
			// just add it without moving things.
			Resize (index + 1);
			::new ((void *)&Array[index]) T(item);
		}
		else
		{
			// Inserting somewhere in the middle of the array,
			// so make room for it
			Resize (Count + 1);

			// Now move items from the index and onward out of the way
			memmove (&Array[index+1], &Array[index], sizeof(T)*(Count - index - 1));

			// And put the new element in
			::new ((void *)&Array[index]) T(item);
		}
	}